

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O0

void __thiscall logfault::Log::~Log(Log *this)

{
  LogManager *this_00;
  Message local_a0;
  string local_60 [32];
  undefined1 local_40 [8];
  Message message;
  Log *this_local;
  
  message._40_8_ = this;
  std::__cxx11::ostringstream::str();
  Message::Message((Message *)local_40,local_60,this->level_);
  std::__cxx11::string::~string((string *)local_60);
  this_00 = LogManager::Instance();
  Message::Message(&local_a0,(Message *)local_40);
  LogManager::LogMessage(this_00,&local_a0);
  Message::~Message(&local_a0);
  Message::~Message((Message *)local_40);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->out_);
  return;
}

Assistant:

~Log() {
            Message message(out_.str(), level_);
            LogManager::Instance().LogMessage(message);
        }